

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O1

void __thiscall
yactfr::internal::JsonVarTypeValReq::JsonVarTypeValReq
          (JsonVarTypeValReq *this,JsonAnyFullDtValReq *anyFullDtValReq)

{
  long lVar1;
  undefined1 local_15b;
  undefined1 local_15a;
  allocator local_159;
  undefined1 local_158 [16];
  element_type *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  Sp local_138;
  optional<unsigned_long_long> local_128;
  string local_118;
  JsonObjValPropReq local_f8;
  optional<unsigned_long_long> local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_d0;
  undefined8 local_98 [2];
  long local_88 [4];
  undefined8 uStack_68;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_60;
  
  (this->super_JsonDtValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonObjValReq_003017b0;
  std::__cxx11::string::string((string *)&local_118,"variant",&local_159);
  local_128.super_type.m_initialized = true;
  local_128.super_type.m_storage = 1;
  local_e0.super_type.m_initialized = false;
  local_148 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<yactfr::internal::JsonVarTypeOptValReq,std::allocator<yactfr::internal::JsonVarTypeOptValReq>,yactfr::internal::JsonAnyFullDtValReq_const&>
            (&_Stack_140,(JsonVarTypeOptValReq **)&local_148,
             (allocator<yactfr::internal::JsonVarTypeOptValReq> *)&local_15b,anyFullDtValReq);
  local_138.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_148;
  local_138.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_140._M_pi;
  JsonArrayValReq::shared((JsonArrayValReq *)local_158,&local_128,&local_e0,&local_138);
  JsonObjValPropReq::JsonObjValPropReq(&local_f8,(Sp *)local_158,true);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  ::pair<const_char_*const_&,_true>(&local_d0,(char **)&strs::opts,&local_f8);
  (anonymous_namespace)::selLocPropReqEntry_abi_cxx11_();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_60,&local_d0,&local_60,0,&local_148,&local_15b,&local_15a);
  JsonDtValReq::JsonDtValReq(&this->super_JsonDtValReq,&local_118,(PropReqs *)&local_60);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_60);
  lVar1 = 0;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_68 + lVar1) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_68 + lVar1));
    }
    if ((void *)((long)local_88 + lVar1) != *(void **)((long)local_98 + lVar1)) {
      operator_delete(*(void **)((long)local_98 + lVar1),*(long *)((long)local_88 + lVar1) + 1);
    }
    lVar1 = lVar1 + -0x38;
  } while (lVar1 != -0x70);
  if (local_f8._valReq.
      super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8._valReq.
               super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((type)local_158._8_8_ != (type)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
  }
  if (local_138.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.
               super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  (this->super_JsonDtValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonObjValReq_003017b0;
  return;
}

Assistant:

explicit JsonVarTypeValReq(const JsonAnyFullDtValReq& anyFullDtValReq) :
        JsonDtValReq {this->typeStr(), {
            {strs::opts, {
                JsonArrayValReq::shared(1, boost::none,
                                        JsonVarTypeOptValReq::shared(anyFullDtValReq)),
                true
            }},
            selLocPropReqEntry(),
        }}
    {
    }